

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetElementsSignatureHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  wally_tx *tx;
  pointer puVar1;
  pointer script;
  ByteData256 *pBVar2;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t sighash;
  value_type_conflict *__val;
  CfdException *pCVar6;
  int ret;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteData256 *local_40;
  SigHashType *local_38;
  
  bVar3 = ByteData::IsEmpty(script_data);
  if (bVar3) {
    local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d0._8_4_ = 0xc12;
    local_c0._M_allocated_capacity = 0x6e9532;
    logger::log<>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"empty script");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = &local_c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Failed to GetSignatureHash. empty script.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x20;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes(&local_58,script_data);
  tx_pointer = (wally_tx *)0x0;
  uVar4 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])(this);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
            (local_d0,this,(ulong)(uVar4 & 0xff));
  ByteData::GetBytes(&local_70,(ByteData *)local_d0);
  local_38 = sighash_type;
  if ((pointer)local_d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity - local_d0._0_8_);
  }
  puVar1 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
  ret = wally_tx_from_bytes(puVar1,(long)local_70.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                            uVar5,&tx_pointer);
  if ((ret == 0) && (tx_pointer != (wally_tx *)0x0)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
               &(value->data_).data_);
    ByteData::GetBytes(&local_88,(ByteData *)local_d0);
    local_40 = __return_storage_ptr__;
    if ((pointer)local_d0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity - local_d0._0_8_);
    }
    if (version == kVersionNone) {
      uVar5 = 0;
    }
    else {
      uVar4 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
      uVar5 = uVar4 & 1;
    }
    script = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    tx = tx_pointer;
    sighash = SigHashType::GetSigHashFlag(local_38);
    ret = wally_tx_get_elements_signature_hash
                    (tx,(ulong)txin_index,script,
                     (long)local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)script,puVar1,
                     (long)local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar1,sighash,uVar5,
                     buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    wally_tx_free(tx_pointer);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pBVar2 = local_40;
    if (ret == 0) {
      ByteData256::ByteData256(local_40,&buffer);
      if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return pBVar2;
    }
    local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d0._8_4_ = 0xc3b;
    local_c0._M_allocated_capacity = 0x6e9532;
    logger::log<int&>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,
                      "wally_tx_get_elements_signature_hash NG[{}] ",&ret);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._0_8_ = &local_c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"SignatureHash generate error.","");
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_d0._8_4_ = 0xc21;
  local_c0._M_allocated_capacity = 0x6e9532;
  logger::log<int&>((CfdSourceLocation *)local_d0,kCfdLogLevelWarning,"wally_tx_from_bytes NG[{}] ",
                    &ret);
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d0._0_8_ = &local_c0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"transaction data invalid.","");
  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_d0);
  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 ConfidentialTransaction::GetElementsSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const ConfidentialValue &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret;

  // Change AbstractTransaction to wally_tx
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), GetWallyFlag(), &tx_pointer);
  if (ret != WALLY_OK || tx_pointer == NULL) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  // Calculate signature hash
  try {
    const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
    uint32_t tx_flag = 0;
    if (version != WitnessVersion::kVersionNone) {
      tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
    }
    ret = wally_tx_get_elements_signature_hash(
        tx_pointer, txin_index, bytes.data(), bytes.size(), value_data.data(),
        value_data.size(), sighash_type.GetSigHashFlag(), tx_flag,
        buffer.data(), buffer.size());
    wally_tx_free(tx_pointer);
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash exception[{}] ",
        ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }
  return ByteData256(buffer);
}